

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string * bloaty::anon_unknown_33::FixedWidthString(string *input,size_t size)

{
  ulong uVar1;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *ret;
  
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < in_RDX) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
    while (uVar1 = std::__cxx11::string::size(), uVar1 < in_RDX) {
      std::__cxx11::string::operator+=((string *)in_RDI," ");
    }
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string FixedWidthString(const std::string& input, size_t size) {
  if (input.size() < size) {
    std::string ret = input;
    while (ret.size() < size) {
      ret += " ";
    }
    return ret;
  } else {
    return input.substr(0, size);
  }
}